

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
ParseUnpackedFromPacked<proto2_unittest::TestAllTypes>::ParseUnpackedFromPacked
          (ParseUnpackedFromPacked<proto2_unittest::TestAllTypes> *this)

{
  WireFormatTest<proto2_unittest::TestAllTypes>::WireFormatTest
            (&this->super_WireFormatTest<proto2_unittest::TestAllTypes>);
  (this->super_WireFormatTest<proto2_unittest::TestAllTypes>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_01641ae0;
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, ParseUnpackedFromPacked) {
  // Serialize using the generated code.
  typename TestFixture::TestPackedTypes source;
  TestUtil::SetPackedFields(&source);
  std::string data = source.SerializeAsString();

  // Parse using WireFormat.
  typename TestFixture::TestUnpackedTypes dest;
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &dest);

  // Check.
  TestUtil::ExpectUnpackedFieldsSet(dest);
}